

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O1

void __thiscall AllReduceSockets::broadcast(AllReduceSockets *this,char *buffer,size_t n)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *__s;
  vw_exception *this_00;
  size_t sVar3;
  ulong parent_read_pos;
  size_t children_sent_pos;
  stringstream __msg;
  size_t local_1e8;
  char *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_1e8 = 0;
  parent_read_pos = 0;
  if ((this->socks).parent == -1) {
    parent_read_pos = n;
  }
  local_1e0 = buffer;
  if (((this->socks).children[0] == -1) && ((this->socks).children[1] == -1)) {
    local_1e8 = n;
  }
  while (((parent_read_pos < n || (local_1e8 < n)) &&
         ((pass_down(this,buffer,parent_read_pos,&local_1e8), parent_read_pos < n || (local_1e8 < n)
          )))) {
    __fd = (this->socks).parent;
    if (__fd != -1) {
      sVar3 = n - parent_read_pos;
      if (sVar3 == 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"I think parent has no data to send but he thinks he has",0x37);
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                   ,0x11d,&local_1d8);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (0xffff < sVar3) {
        sVar3 = 0x10000;
      }
      sVar1 = recv(__fd,buffer + parent_read_pos,sVar3,0);
      if ((int)sVar1 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," recv from parent: ",0x13);
        piVar2 = __errno_location();
        __s = strerror(*piVar2);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d2a28);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      parent_read_pos = parent_read_pos + (long)(int)sVar1;
      buffer = local_1e0;
    }
  }
  return;
}

Assistant:

void AllReduceSockets::broadcast(char* buffer, const size_t n)
{
  size_t parent_read_pos = 0;    // First unread float from parent
  size_t children_sent_pos = 0;  // First unsent float to children
  // parent_sent_pos <= left_read_pos
  // parent_sent_pos <= right_read_pos

  if (socks.parent == -1)
  {
    parent_read_pos = n;
  }
  if (socks.children[0] == -1 && socks.children[1] == -1)
    children_sent_pos = n;

  while (parent_read_pos < n || children_sent_pos < n)
  {
    pass_down(buffer, parent_read_pos, children_sent_pos);
    if (parent_read_pos >= n && children_sent_pos >= n)
      break;

    if (socks.parent != -1)
    {
      // there is data to be read from the parent
      if (parent_read_pos == n)
        THROW("I think parent has no data to send but he thinks he has");

      size_t count = min(ar_buf_size, n - parent_read_pos);
      int read_size = recv(socks.parent, buffer + parent_read_pos, (int)count, 0);
      if (read_size == -1)
      {
        cerr << " recv from parent: " << strerror(errno) << endl;
      }
      parent_read_pos += read_size;
    }
  }
}